

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O2

void idx2::ComputeBrickResolution(brick_pool *Bp)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  idx2_file *this;
  undefined8 uVar5;
  char cVar6;
  long lVar7;
  u64 uVar8;
  int iVar9;
  v3<int> *pvVar10;
  byte bVar11;
  byte bVar12;
  int I;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar20;
  ulong uVar21;
  v3i Brick3;
  int aiStack_1028 [3];
  i8 aiStack_101c [1948];
  int local_880;
  u64 BrickKey;
  iterator BrickIt;
  stack_item Stack [128];
  
  this = Bp->Idx2;
  lVar7 = 0xd;
  do {
    *(undefined8 *)((long)Stack + lVar7 + -0xd) = 0;
    *(undefined4 *)((long)Stack + lVar7 + -5) = 0;
    *(undefined2 *)((long)Stack + lVar7 + -1) = 0xffff;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x80d);
  Stack[0].Brick3.field_0.field_3.XY.field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  Stack[0].Brick3.field_0.field_0.Z = 0;
  Stack[0].ResolutionToSet = this->NLevels + -1;
  Stack[0].Level = Stack[0].ResolutionToSet;
  iVar15 = 0;
  local_880 = 0;
  iVar19 = 0;
  bVar12 = 0;
  while( true ) {
    do {
      if ((char)bVar12 < '\0') {
        return;
      }
      bVar11 = bVar12 - 1;
      uVar5 = *(undefined8 *)&Stack[bVar12].Brick3.field_0;
      uVar2 = Stack[bVar12].Brick3.field_0.field_0.Z;
      bVar1 = Stack[bVar12].Level;
      uVar21 = (ulong)(char)bVar1;
      bVar12 = Stack[bVar12].ResolutionToSet;
      Brick3.field_0._0_8_ = (unsigned_long *)CONCAT44(0,uVar2);
      Brick3.field_0.field_0.Z = iVar15;
      iVar9 = (int)uVar5;
      uVar8 = GetLinearBrick((idx2 *)this,(idx2_file *)(uVar21 & 0xffffffff),iVar9,Brick3);
      BrickKey = uVar8 * 0x10 + uVar21;
      Lookup<unsigned_long,idx2::brick_volume>
                (&BrickIt,(idx2 *)Bp,(hash_table<unsigned_long,_idx2::brick_volume> *)&BrickKey,
                 Brick3.field_0._0_8_);
      if ((BrickIt.Ht)->Stats[BrickIt.Idx] == Occupied) {
        bVar12 = bVar1;
      }
      if ((long)uVar21 < 1) {
        if ('\0' < (char)bVar12) {
          (Bp->ResolutionLevels).Buffer.Data[uVar8] = bVar12;
        }
      }
      else {
        iVar3 = (this->GroupBrick3).field_0.field_0.X;
        iVar17 = (this->GroupBrick3).field_0.field_0.Y;
        iVar4 = (this->GroupBrick3).field_0.field_0.Z;
        pvVar10 = (this->NBricks3).Arr + (byte)(bVar1 - 1);
        for (uVar13 = 0; uVar13 != 8; uVar13 = uVar13 + 1) {
          iVar18 = (int)((ulong)uVar5 >> 0x20) * iVar17 + (uint)((uVar13 >> 1 & 1) != 0);
          iVar14 = (uVar2 * iVar4 + 1) - (uint)(uVar13 < 4);
          if (0x10 < bVar1) goto LAB_00167b42;
          iVar16 = (uVar13 & 1) + iVar9 * iVar3;
          if (((iVar16 < (pvVar10->field_0).field_0.X) && (iVar18 < (pvVar10->field_0).field_0.Y))
             && (iVar14 < (pvVar10->field_0).field_0.Z)) {
            aVar20.field_0.Y = iVar18;
            aVar20.field_0.X = iVar16;
            bVar11 = bVar11 + 1;
            Stack[(char)bVar11].Brick3.field_0.field_3.XY.field_0 = aVar20;
            Stack[(char)bVar11].Brick3.field_0.field_0.Z = iVar14;
            Stack[(char)bVar11].Level = bVar1 - 1;
            Stack[(char)bVar11].ResolutionToSet = bVar12;
          }
        }
      }
      bVar12 = bVar11;
    } while (-1 < (char)bVar11);
    cVar6 = this->NLevels;
    lVar7 = (long)cVar6;
    if (0x10 < lVar7) break;
    iVar15 = iVar15 + 1;
    iVar9 = (this->NBricks3).Arr[lVar7 + -1].field_0.field_0.X;
    if (iVar9 <= iVar15) {
      iVar17 = local_880 + 1;
      iVar15 = 0;
      iVar3 = (this->NBricks3).Arr[lVar7 + -1].field_0.field_0.Y;
      local_880 = iVar17;
      if (iVar3 <= iVar17) {
        local_880 = iVar15;
      }
      iVar19 = iVar19 + (uint)(iVar3 <= iVar17);
    }
    if (((iVar15 < iVar9) && (local_880 < (this->NBricks3).Arr[lVar7 + -1].field_0.field_0.Y)) &&
       (iVar19 < (this->NBricks3).Arr[lVar7 + -1].field_0.field_0.Z)) {
      bVar12 = bVar11 + 1;
      Stack[(long)(char)bVar11 + 1].Brick3.field_0.field_0.X = iVar15;
      Stack[(long)(char)bVar11 + 1].Brick3.field_0.field_0.Y = local_880;
      Stack[(long)(char)bVar11 + 1].Brick3.field_0.field_0.Z = iVar19;
      cVar6 = cVar6 + -1;
      Stack[(long)(char)bVar11 + 1].ResolutionToSet = cVar6;
      Stack[(long)(char)bVar11 + 1].Level = cVar6;
    }
  }
LAB_00167b42:
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,
                "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
               );
}

Assistant:

void
ComputeBrickResolution(brick_pool* Bp)
{
  const idx2_file* Idx2 = Bp->Idx2;
  stack_item Stack[idx2_file::MaxLevels * 8];
  i8 LastIndex = 0;
  /* push all bricks at the coarsest level */
  v3i CurrCoarsestBrick = v3i(0);
  stack_item& First = Stack[LastIndex];
  First.Brick3 = CurrCoarsestBrick;
  First.Level = First.ResolutionToSet = Idx2->NLevels - 1;
  //i64 Count = 0;
  while (LastIndex >= 0)
  {
    // pop the stack
    stack_item Current = Stack[LastIndex--];
    // get the current brick
    u64 BrickIndex = GetLinearBrick(*Idx2, Current.Level, Current.Brick3);
    u64 BrickKey = GetBrickKey(Current.Level, BrickIndex);
    auto BrickIt = Lookup(Bp->BrickTable, BrickKey);

    if (BrickIt)
    {
      idx2_Assert(BrickIt.Val->Significant);
      Current.ResolutionToSet = Current.Level;
    }
    // push the children if not at the finest level
    if (Current.Level > 0)
    {
      i8 NextLevel = Current.Level - 1;
      for (int I = 0; I < 8; ++I)
      {
        int X = BitSet(I, 0);
        int Y = BitSet(I, 1);
        int Z = BitSet(I, 2);
        v3i ChildBrick3 = Current.Brick3 * Idx2->GroupBrick3 + v3i(X, Y, Z);
        if (ChildBrick3 < Idx2->NBricks3[NextLevel])
        {
          stack_item& Child = Stack[++LastIndex];
          Child.Brick3 = ChildBrick3;
          Child.Level = Current.Level - 1;
          Child.ResolutionToSet = Current.ResolutionToSet;
        }
      }
    }
    else // finest level, set the level if necessary
    {
      // TODO: we should just stuff 4 bits into the brick key instead of using a separate
      // ResolutionStream
      if (Current.ResolutionToSet > 0)
      {// by default, the bit stream is init to 0 so no need to write if ResolutionToSet == 0
        Bp->ResolutionLevels[BrickIndex] = Current.ResolutionToSet;
      }
      //printf("level = %d\n", Current.ResolutionToSet);
      //v3i Brick3 = GetSpatialBrick(*Idx2, Current.Level, BrickIndex);
      //idx2_Assert(Brick3 == Current.Brick3);
      //++Count;
    }

    /* push the next brick at the coarsest resolution if stack is empty */
    if (LastIndex < 0)
    {
      ++CurrCoarsestBrick.X;
      if (CurrCoarsestBrick.X >= Idx2->NBricks3[Idx2->NLevels - 1].X)
      {
        CurrCoarsestBrick.X = 0;
        ++CurrCoarsestBrick.Y;
        if (CurrCoarsestBrick.Y >= Idx2->NBricks3[Idx2->NLevels - 1].Y)
        {
          CurrCoarsestBrick.Y = 0;
          ++CurrCoarsestBrick.Z;
        }
      }
      if (CurrCoarsestBrick < Idx2->NBricks3[Idx2->NLevels - 1])
      {
        stack_item& Next = Stack[++LastIndex];
        Next.Brick3 = CurrCoarsestBrick;
        Next.Level = Next.ResolutionToSet = Idx2->NLevels - 1;
      }
    }
  }

  //printf("num finest bricks = %" PRIi64 "\n", Count);
}